

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_address.c
# Opt level: O2

void load_address(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = thminstr->raw;
  uVar4 = (ulong)(uVar1 >> 8 & 7);
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar2 = state->pc & 0xfffffffd;
  }
  else {
    uVar2 = ((state->cpsr).raw & 0x1f) - 0x11;
    lVar3 = 0x80;
    if (uVar2 < 0xb) {
      lVar3 = *(long *)(&DAT_00120fa8 + (ulong)uVar2 * 8);
    }
    uVar2 = *(uint *)((long)state->r + lVar3 + -0x38);
  }
  uVar2 = (uint)(byte)uVar1 * 4 + uVar2;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",uVar4,(ulong)uVar2);
  }
  state->r[uVar4] = uVar2;
  return;
}

Assistant:

void load_address(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_address_t* instr = &thminstr->LOAD_ADDRESS;
    half offset = instr->word8 << 2;

    if (instr->sp) {
        set_register(state, instr->rd, get_sp(state) + offset);
    } else {
        set_register(state, instr->rd, (state->pc & 0xFFFFFFFD) + offset);
    }
}